

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O3

int print_bar(WINDOW *w,int y,int x,int size,double vol,char ch_on,char ch_off,int attr_on)

{
  int in_EAX;
  int iVar1;
  double dVar2;
  double dVar3;
  
  if (1 < x) {
    in_EAX = wmove(w,0,y);
    if (in_EAX != -1) {
      waddch(w,0x5b);
      if (x != 2) {
        iVar1 = x + -2;
        dVar2 = (double)iVar1;
        dVar3 = 0.0;
        do {
          if (vol <= dVar3 / dVar2) {
            waddch(w,0x2d);
          }
          else {
            wattr_on(w,size,0);
            waddch(w,0x2a);
            wattr_off(w,size,0);
          }
          dVar3 = dVar3 + 1.0;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      iVar1 = waddch(w,0x5d);
      return iVar1;
    }
  }
  return in_EAX;
}

Assistant:

static int print_bar(
    WINDOW *w, int y, int x, int size,
    double vol, char ch_on, char ch_off, int attr_on)
{
    if (size < 2)
        return ERR;
    if (wmove(w, y, x) == ERR)
        return ERR;
    waddch(w, '[');
    for (int i = 0; i < size - 2; ++i) {
        double ref = (double)i / (size - 2);
        bool gt = vol > ref;
        if (gt) wattron(w, attr_on);
        waddch(w, gt ? ch_on : ch_off);
        if (gt) wattroff(w, attr_on);
    }
    waddch(w, ']');
    return OK;
}